

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O1

void __thiscall wallet::WalletDescriptor::DeserializeDescriptor(WalletDescriptor *this,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  char *pcVar3;
  undefined8 uVar4;
  char unaff_BPL;
  long in_FS_OFFSET;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  FlatSigningProvider keys;
  string error;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  FlatSigningProvider local_140;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_013bcda8;
  local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  Parse(&local_178,str,&local_140,&local_48,true);
  if (local_178.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_178.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    std::operator+(&local_160,"Invalid descriptor: ",&local_48);
    std::ios_base::failure[abi:cxx11]::failure(psVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(psVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else if ((ulong)((long)local_178.
                         super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.
                         super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) < 2) {
    if ((long)local_178.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_178.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)this,
                 local_178.
                 super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      DescriptorID((uint256 *)&local_160,
                   (this->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      *(size_type *)((this->id).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_160.field_2._M_allocated_capacity;
      *(undefined8 *)((this->id).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_160.field_2._8_8_;
      *(ulong *)(this->id).super_base_blob<256U>.m_data._M_elems =
           CONCAT44(local_160._M_dataplus._M_p._4_4_,local_160._M_dataplus._M_p._0_4_);
      *(size_type *)((this->id).super_base_blob<256U>.m_data._M_elems + 8) =
           local_160._M_string_length;
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::~vector(&local_178);
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::~_Rb_tree(&local_140.tr_trees._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::~_Rb_tree(&local_140.keys._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&local_140.origins._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::~_Rb_tree(&local_140.pubkeys._M_t);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::~_Rb_tree(&local_140.scripts._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_160._M_dataplus._M_p._4_4_,local_160._M_dataplus._M_p._0_4_) !=
          &local_160.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_160._M_dataplus._M_p._4_4_,local_160._M_dataplus._M_p._0_4_),
                        local_160.field_2._M_allocated_capacity + 1);
      }
      if (unaff_BPL != '\0') {
        __cxa_free_exception();
      }
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::~vector(&local_178);
      FlatSigningProvider::~FlatSigningProvider(&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        _Unwind_Resume(uVar4);
      }
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    local_160._M_string_length = std::iostream_category();
    local_160._M_dataplus._M_p._0_4_ = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"Can\'t load a multipath descriptor from databases");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeDescriptor(const std::string& str)
    {
        std::string error;
        FlatSigningProvider keys;
        auto descs = Parse(str, keys, error, true);
        if (descs.empty()) {
            throw std::ios_base::failure("Invalid descriptor: " + error);
        }
        if (descs.size() > 1) {
            throw std::ios_base::failure("Can't load a multipath descriptor from databases");
        }
        descriptor = std::move(descs.at(0));
        id = DescriptorID(*descriptor);
    }